

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  string *str;
  ostream *poVar1;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  cmAlphaNum local_d0;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string binpath;
  string outpath;
  string *config_local;
  ostream *fout_local;
  cmGhsMultiTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(binpath.field_2._M_local_buf + 8));
  if (this->TagType != SUBPROJECT) {
    str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                    (&this->LocalGenerator->super_cmLocalGenerator);
    cmAlphaNum::cmAlphaNum(&local_90,str);
    cmAlphaNum::cmAlphaNum(&local_d0,'/');
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
              (&local_f0,this->LocalGenerator,this->GeneratorTarget);
    cmStrCat<std::__cxx11::string>((string *)local_60,&local_90,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    cmGeneratorTarget::GetDirectory(&local_130,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    cmSystemTools::RelativePath(&local_110,(string *)local_60,&local_130);
    std::__cxx11::string::operator=
              ((string *)(binpath.field_2._M_local_buf + 8),(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    poVar1 = std::operator<<(fout,"    :binDirRelative=\"");
    poVar1 = std::operator<<(poVar1,(string *)(binpath.field_2._M_local_buf + 8));
    poVar1 = std::operator<<(poVar1,"\"\n    -o \"");
    poVar1 = std::operator<<(poVar1,(string *)&this->TargetNameReal);
    std::operator<<(poVar1,"\"\n");
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::operator=((string *)(binpath.field_2._M_local_buf + 8),".");
  poVar1 = std::operator<<(fout,"    :outputDirRelative=\"");
  poVar1 = std::operator<<(poVar1,(string *)(binpath.field_2._M_local_buf + 8));
  std::operator<<(poVar1,"\"\n");
  std::__cxx11::string::~string((string *)(binpath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;

  /* Determine paths from the target project file to where the output artifacts
   * need to be located.
   */
  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    std::string binpath = cmStrCat(
      this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
    outpath = cmSystemTools::RelativePath(
      binpath, this->GeneratorTarget->GetDirectory(config));
    /* clang-format off */
    fout << "    :binDirRelative=\"" << outpath << "\"\n"
            "    -o \"" << this->TargetNameReal << "\"\n";
    /* clang-format on */
  }

  // set target object file destination
  outpath = ".";
  fout << "    :outputDirRelative=\"" << outpath << "\"\n";
}